

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_impl_ssse3.c
# Opt level: O0

void aom_var_filter_block2d_bil_first_pass_ssse3
               (uint8_t *a,uint16_t *b,uint src_pixels_per_line,uint pixel_step,uint output_height,
               uint output_width,uint8_t *filter)

{
  byte bVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 uVar8;
  undefined8 uVar9;
  uint in_EDX;
  void *in_RSI;
  longlong lVar10;
  void *in_RDI;
  uint in_R8D;
  uint in_R9D;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined1 auVar12 [16];
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar13 [16];
  __m128i alVar14;
  __m128i v;
  byte *in_stack_00000008;
  __m128i res_1;
  __m128i source_shuffle;
  __m128i source_1;
  __m128i shuffle_mask;
  __m128i res;
  __m128i source;
  __m128i source_hi;
  __m128i source_low;
  uint j;
  uint i;
  __m128i filters;
  int8_t f1;
  int8_t f0;
  __m128i r;
  int16_t round;
  uint local_220;
  uint local_21c;
  void *local_1d0;
  void *local_1c8;
  undefined1 local_198;
  undefined1 uStack_197;
  undefined1 uStack_196;
  undefined1 uStack_195;
  undefined1 uStack_194;
  undefined1 uStack_193;
  undefined1 uStack_192;
  undefined1 uStack_191;
  undefined1 local_188;
  undefined1 uStack_187;
  undefined1 uStack_186;
  undefined1 uStack_185;
  undefined1 uStack_184;
  undefined1 uStack_183;
  undefined1 uStack_182;
  undefined1 uStack_181;
  short local_e8;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  short sStack_e0;
  short sStack_de;
  short sStack_dc;
  short sStack_da;
  short local_c8;
  short sStack_c6;
  short sStack_c4;
  short sStack_c2;
  short sStack_c0;
  short sStack_be;
  short sStack_bc;
  short sStack_ba;
  undefined7 uVar11;
  
  bVar1 = *in_stack_00000008 >> 1;
  bVar2 = in_stack_00000008[1] >> 1;
  uVar11 = (undefined7)((ulong)in_RSI >> 8);
  lVar10 = CONCAT71(uVar11,bVar2);
  uVar8 = CONCAT17(bVar2,CONCAT16(bVar1,CONCAT15(bVar2,CONCAT14(bVar1,CONCAT13(bVar2,CONCAT12(bVar1,
                                                  CONCAT11(bVar2,bVar1)))))));
  uVar9 = CONCAT17(bVar2,CONCAT16(bVar1,CONCAT15(bVar2,CONCAT14(bVar1,CONCAT13(bVar2,CONCAT12(bVar1,
                                                  CONCAT11(bVar2,bVar1)))))));
  local_1d0 = in_RSI;
  local_1c8 = in_RDI;
  if (in_R9D < 8) {
    lVar10 = CONCAT71(uVar11,2);
    for (local_21c = 0; local_21c < in_R8D; local_21c = local_21c + 1) {
      alVar14 = xx_loadl_64(local_1c8);
      auVar7._8_8_ = extraout_XMM0_Qb;
      auVar7._0_8_ = extraout_XMM0_Qa_01;
      auVar6._8_8_ = 0x807070606050504;
      auVar6._0_8_ = 0x403030202010100;
      auVar13 = pshufb(auVar7,auVar6);
      auVar12._8_8_ = uVar9;
      auVar12._0_8_ = uVar8;
      auVar12 = pmaddubsw(auVar13,auVar12);
      local_e8 = auVar12._0_2_;
      sStack_e6 = auVar12._2_2_;
      sStack_e4 = auVar12._4_2_;
      sStack_e2 = auVar12._6_2_;
      sStack_e0 = auVar12._8_2_;
      sStack_de = auVar12._10_2_;
      sStack_dc = auVar12._12_2_;
      sStack_da = auVar12._14_2_;
      auVar13._2_2_ = sStack_e6 + 0x20;
      auVar13._0_2_ = local_e8 + 0x20;
      auVar13._4_2_ = sStack_e4 + 0x20;
      auVar13._6_2_ = sStack_e2 + 0x20;
      auVar13._8_2_ = sStack_e0 + 0x20;
      auVar13._10_2_ = sStack_de + 0x20;
      auVar13._12_2_ = sStack_dc + 0x20;
      auVar13._14_2_ = sStack_da + 0x20;
      psraw(auVar13,ZEXT416(6));
      alVar14[0] = lVar10;
      xx_storel_64(local_1d0,alVar14);
      local_1c8 = (void *)((long)local_1c8 + (ulong)in_EDX);
      local_1d0 = (void *)((long)local_1d0 + (ulong)in_R9D * 2);
    }
  }
  else {
    for (local_21c = 0; local_21c < in_R8D; local_21c = local_21c + 1) {
      for (local_220 = 0; local_220 < in_R9D; local_220 = local_220 + 8) {
        xx_loadl_64(local_1c8);
        alVar14 = xx_loadl_64((void *)((long)local_1c8 + 1));
        v[1] = alVar14[1];
        local_188 = (undefined1)extraout_XMM0_Qa;
        uStack_187 = (undefined1)((ulong)extraout_XMM0_Qa >> 8);
        uStack_186 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x10);
        uStack_185 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x18);
        uStack_184 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x20);
        uStack_183 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x28);
        uStack_182 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x30);
        uStack_181 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x38);
        local_198 = (undefined1)extraout_XMM0_Qa_00;
        uStack_197 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 8);
        uStack_196 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x10);
        uStack_195 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x18);
        uStack_194 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x20);
        uStack_193 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x28);
        uStack_192 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x30);
        uStack_191 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x38);
        auVar4[1] = local_198;
        auVar4[0] = local_188;
        auVar4[2] = uStack_187;
        auVar4[3] = uStack_197;
        auVar4[4] = uStack_186;
        auVar4[5] = uStack_196;
        auVar4[6] = uStack_185;
        auVar4[7] = uStack_195;
        auVar4[9] = uStack_194;
        auVar4[8] = uStack_184;
        auVar4[10] = uStack_183;
        auVar4[0xb] = uStack_193;
        auVar4[0xc] = uStack_182;
        auVar4[0xd] = uStack_192;
        auVar4[0xe] = uStack_181;
        auVar4[0xf] = uStack_191;
        auVar3._8_8_ = uVar9;
        auVar3._0_8_ = uVar8;
        auVar12 = pmaddubsw(auVar4,auVar3);
        local_c8 = auVar12._0_2_;
        sStack_c6 = auVar12._2_2_;
        sStack_c4 = auVar12._4_2_;
        sStack_c2 = auVar12._6_2_;
        sStack_c0 = auVar12._8_2_;
        sStack_be = auVar12._10_2_;
        sStack_bc = auVar12._12_2_;
        sStack_ba = auVar12._14_2_;
        auVar5._2_2_ = sStack_c6 + 0x20;
        auVar5._0_2_ = local_c8 + 0x20;
        auVar5._4_2_ = sStack_c4 + 0x20;
        auVar5._6_2_ = sStack_c2 + 0x20;
        auVar5._8_2_ = sStack_c0 + 0x20;
        auVar5._10_2_ = sStack_be + 0x20;
        auVar5._12_2_ = sStack_bc + 0x20;
        auVar5._14_2_ = sStack_ba + 0x20;
        psraw(auVar5,ZEXT416(6));
        v[0] = lVar10;
        xx_storeu_128(local_1d0,v);
        local_1c8 = (void *)((long)local_1c8 + 8);
        local_1d0 = (void *)((long)local_1d0 + 0x10);
      }
      local_1c8 = (void *)((long)local_1c8 + (ulong)(in_EDX - in_R9D));
    }
  }
  return;
}

Assistant:

void aom_var_filter_block2d_bil_first_pass_ssse3(
    const uint8_t *a, uint16_t *b, unsigned int src_pixels_per_line,
    unsigned int pixel_step, unsigned int output_height,
    unsigned int output_width, const uint8_t *filter) {
  // Note: filter[0], filter[1] could be {128, 0}, where 128 will overflow
  // in computation using _mm_maddubs_epi16.
  // Change {128, 0} to {64, 0} and reduce FILTER_BITS by 1 to avoid overflow.
  const int16_t round = (1 << (FILTER_BITS - 1)) >> 1;
  const __m128i r = _mm_set1_epi16(round);
  const int8_t f0 = (int8_t)(filter[0] >> 1);
  const int8_t f1 = (int8_t)(filter[1] >> 1);
  const __m128i filters = _mm_setr_epi8(f0, f1, f0, f1, f0, f1, f0, f1, f0, f1,
                                        f0, f1, f0, f1, f0, f1);
  unsigned int i, j;
  (void)pixel_step;

  if (output_width >= 8) {
    for (i = 0; i < output_height; ++i) {
      for (j = 0; j < output_width; j += 8) {
        // load source
        __m128i source_low = xx_loadl_64(a);
        __m128i source_hi = xx_loadl_64(a + 1);

        // unpack to:
        // { a[0], a[1], a[1], a[2], a[2], a[3], a[3], a[4],
        //   a[4], a[5], a[5], a[6], a[6], a[7], a[7], a[8] }
        __m128i source = _mm_unpacklo_epi8(source_low, source_hi);

        // b[i] = a[i] * filter[0] + a[i + 1] * filter[1]
        __m128i res = _mm_maddubs_epi16(source, filters);

        // round
        res = _mm_srai_epi16(_mm_add_epi16(res, r), FILTER_BITS - 1);

        xx_storeu_128(b, res);

        a += 8;
        b += 8;
      }

      a += src_pixels_per_line - output_width;
    }
  } else {
    const __m128i shuffle_mask =
        _mm_setr_epi8(0, 1, 1, 2, 2, 3, 3, 4, 4, 5, 5, 6, 6, 7, 7, 8);
    for (i = 0; i < output_height; ++i) {
      // load source, only first 5 values are meaningful:
      // { a[0], a[1], a[2], a[3], a[4], xxxx }
      __m128i source = xx_loadl_64(a);

      // shuffle, up to the first 8 are useful
      // { a[0], a[1], a[1], a[2], a[2], a[3], a[3], a[4],
      //   a[4], a[5], a[5], a[6], a[6], a[7], a[7], a[8] }
      __m128i source_shuffle = _mm_shuffle_epi8(source, shuffle_mask);

      __m128i res = _mm_maddubs_epi16(source_shuffle, filters);
      res = _mm_srai_epi16(_mm_add_epi16(res, r), FILTER_BITS - 1);

      xx_storel_64(b, res);

      a += src_pixels_per_line;
      b += output_width;
    }
  }
}